

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O3

void __thiscall mp::pre::ValuePresolver::~ValuePresolver(ValuePresolver *this)

{
  ~ValuePresolver(this);
  operator_delete(this,0x380);
  return;
}

Assistant:

ValuePresolver(BasicFlatModel& m, Env& env,
                 BasicLogger& bts,
                 SolCheckerType sc={}, PrePostsolverType pps={})
      : ValuePresolverImpl(env, bts), model_(m), solchk_(sc), preposts_(pps) { }